

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::QuadMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  PrimRef *pPVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  size_t sVar13;
  ulong uVar14;
  unsigned_long uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  uVar15 = r->_end;
  aVar19 = _DAT_01f7aa00;
  aVar20 = _DAT_01f7a9f0;
  aVar21 = _DAT_01f7a9f0;
  aVar22 = _DAT_01f7aa00;
  if (uVar14 < uVar15) {
    sVar9 = 0;
    do {
      lVar3 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
      pBVar4 = (this->super_QuadMesh).vertices.items;
      lVar10 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar14;
      uVar16 = (ulong)*(uint *)(lVar3 + lVar10);
      uVar5 = (pBVar4->super_RawBufferView).num;
      sVar13 = k;
      if ((((uVar16 < uVar5) && (uVar18 = (ulong)*(uint *)(lVar3 + 4 + lVar10), uVar18 < uVar5)) &&
          (uVar17 = (ulong)*(uint *)(lVar3 + 8 + lVar10), uVar17 < uVar5)) &&
         (uVar11 = (ulong)*(uint *)(lVar3 + 0xc + lVar10), uVar11 < uVar5)) {
        pcVar6 = pBVar4[itime].super_RawBufferView.ptr_ofs;
        sVar7 = pBVar4[itime].super_RawBufferView.stride;
        auVar23 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar16);
        auVar25._0_4_ = -(uint)(auVar23._0_4_ < 1.844e+18 && -1.844e+18 < auVar23._0_4_);
        auVar25._4_4_ = -(uint)(auVar23._4_4_ < 1.844e+18 && -1.844e+18 < auVar23._4_4_);
        auVar25._8_4_ = -(uint)(auVar23._8_4_ < 1.844e+18 && -1.844e+18 < auVar23._8_4_);
        auVar25._12_4_ = -(uint)(auVar23._12_4_ < 1.844e+18 && -1.844e+18 < auVar23._12_4_);
        uVar12 = movmskps((int)(sVar7 * uVar16),auVar25);
        if ((~(byte)uVar12 & 7) == 0) {
          auVar25 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar18);
          auVar2._4_4_ = -(uint)(auVar25._4_4_ < 1.844e+18 && -1.844e+18 < auVar25._4_4_);
          auVar2._0_4_ = -(uint)(auVar25._0_4_ < 1.844e+18 && -1.844e+18 < auVar25._0_4_);
          auVar2._8_4_ = -(uint)(auVar25._8_4_ < 1.844e+18 && -1.844e+18 < auVar25._8_4_);
          auVar2._12_4_ = -(uint)(auVar25._12_4_ < 1.844e+18 && -1.844e+18 < auVar25._12_4_);
          uVar12 = movmskps((int)(sVar7 * uVar18),auVar2);
          if ((~(byte)uVar12 & 7) == 0) {
            auVar2 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar17);
            auVar26._0_4_ = -(uint)(-1.844e+18 < auVar2._0_4_ && auVar2._0_4_ < 1.844e+18);
            auVar26._4_4_ = -(uint)(-1.844e+18 < auVar2._4_4_ && auVar2._4_4_ < 1.844e+18);
            auVar26._8_4_ = -(uint)(-1.844e+18 < auVar2._8_4_ && auVar2._8_4_ < 1.844e+18);
            auVar26._12_4_ = -(uint)(-1.844e+18 < auVar2._12_4_ && auVar2._12_4_ < 1.844e+18);
            uVar12 = movmskps((int)(sVar7 * uVar17),auVar26);
            if ((~(byte)uVar12 & 7) == 0) {
              auVar26 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar11);
              auVar30._0_4_ = -(uint)(auVar26._0_4_ < 1.844e+18 && -1.844e+18 < auVar26._0_4_);
              auVar30._4_4_ = -(uint)(auVar26._4_4_ < 1.844e+18 && -1.844e+18 < auVar26._4_4_);
              auVar30._8_4_ = -(uint)(auVar26._8_4_ < 1.844e+18 && -1.844e+18 < auVar26._8_4_);
              auVar30._12_4_ = -(uint)(auVar26._12_4_ < 1.844e+18 && -1.844e+18 < auVar26._12_4_);
              uVar12 = movmskps((int)(sVar7 * uVar11),auVar30);
              if ((~(byte)uVar12 & 7) == 0) {
                pcVar6 = pBVar4[itime + 1].super_RawBufferView.ptr_ofs;
                sVar7 = pBVar4[itime + 1].super_RawBufferView.stride;
                pfVar1 = (float *)(pcVar6 + uVar16 * sVar7);
                auVar33._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                auVar33._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                auVar33._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                auVar33._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar33);
                if ((~(byte)uVar12 & 7) == 0) {
                  pfVar1 = (float *)(pcVar6 + uVar18 * sVar7);
                  auVar27._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                  auVar27._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                  auVar27._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                  auVar27._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                  uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar27);
                  if ((~(byte)uVar12 & 7) == 0) {
                    pfVar1 = (float *)(pcVar6 + uVar17 * sVar7);
                    auVar28._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                    auVar28._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                    auVar28._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                    auVar28._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                    uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar28);
                    if ((~(byte)uVar12 & 7) == 0) {
                      pfVar1 = (float *)(pcVar6 + sVar7 * uVar11);
                      auVar29._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                      auVar29._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                      auVar29._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                      auVar29._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                      uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar29);
                      if ((~(byte)uVar12 & 7) == 0) {
                        auVar30 = minps(auVar23,auVar25);
                        auVar33 = minps(auVar2,auVar26);
                        auVar30 = minps(auVar30,auVar33);
                        auVar23 = maxps(auVar23,auVar25);
                        auVar25 = maxps(auVar2,auVar26);
                        auVar23 = maxps(auVar23,auVar25);
                        aVar31._0_12_ = auVar30._0_12_;
                        aVar31.m128[3] = (float)geomID;
                        aVar24._0_12_ = auVar23._0_12_;
                        aVar24.m128[3] = (float)uVar14;
                        aVar20.m128 = (__m128)minps(aVar20.m128,aVar31.m128);
                        aVar19.m128 = (__m128)maxps(aVar19.m128,aVar24.m128);
                        sVar13 = k + 1;
                        pPVar8 = prims->items;
                        pPVar8[k].lower.field_0 = aVar31;
                        auVar32._0_4_ = auVar30._0_4_ + auVar23._0_4_;
                        auVar32._4_4_ = auVar30._4_4_ + auVar23._4_4_;
                        auVar32._8_4_ = auVar30._8_4_ + auVar23._8_4_;
                        auVar32._12_4_ = (float)geomID + (float)uVar14;
                        aVar21.m128 = (__m128)minps(aVar21.m128,auVar32);
                        aVar22.m128 = (__m128)maxps(aVar22.m128,auVar32);
                        sVar9 = sVar9 + 1;
                        pPVar8[k].upper.field_0 = aVar24;
                        uVar15 = r->_end;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar14 = uVar14 + 1;
      k = sVar13;
    } while (uVar14 < uVar15);
  }
  else {
    sVar9 = 0;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar22;
  __return_storage_ptr__->end = sVar9;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }